

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

int fasttext::getArgGauss<int>
              (int val,minstd_rand *rng,double startSigma,double endSigma,double t,bool linear)

{
  double *pdVar1;
  byte in_DL;
  int in_EDI;
  double in_XMM0_Qa;
  normal_distribution<double> *this;
  result_type_conflict __y;
  double dVar2;
  undefined1 auVar3 [16];
  double in_XMM1_Qa;
  undefined1 auVar4 [16];
  double in_XMM2_Qa;
  undefined1 auVar5 [16];
  double updateCoeff;
  double coeff;
  normal_distribution<double> normal;
  double stddev;
  int returnValue;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff68;
  normal_distribution<double> *in_stack_ffffffffffffff80;
  double local_50;
  double local_48;
  double local_40;
  undefined8 local_38;
  int local_30;
  byte local_29;
  int local_4;
  
  local_29 = in_DL & 1;
  this = (normal_distribution<double> *)((in_XMM0_Qa - in_XMM1_Qa) / 0.5);
  local_40 = 0.5;
  local_48 = in_XMM2_Qa - 0.25;
  local_50 = 0.0;
  local_4 = in_EDI;
  pdVar1 = std::max<double>(&local_48,&local_50);
  pdVar1 = std::min<double>(&local_40,pdVar1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pdVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = -(double)this;
  auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
  local_38 = auVar3._0_8_;
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffff80,in_XMM0_Qa,(result_type_conflict)this);
  __y = std::normal_distribution<double>::operator()(this,in_stack_ffffffffffffff68);
  if ((local_29 & 1) == 0) {
    dVar2 = pow(2.0,__y);
    dVar2 = dVar2 * (double)local_4;
  }
  else {
    dVar2 = __y + (double)local_4;
  }
  local_30 = (int)dVar2;
  return local_30;
}

Assistant:

T getArgGauss(
    T val,
    std::minstd_rand& rng,
    double startSigma,
    double endSigma,
    double t,
    bool linear) {
  T returnValue;
  const double stddev = startSigma -
      ((startSigma - endSigma) / 0.5) *
          std::min(0.5, std::max((t - 0.25), 0.0));

  std::normal_distribution<double> normal(0.0, stddev);

  const double coeff = normal(rng);
  double updateCoeff = 0.0;

  if (linear) {
    updateCoeff = coeff;
    returnValue = static_cast<T>(updateCoeff + val);
  } else {
    updateCoeff = std::pow(2.0, coeff);
    returnValue = static_cast<T>(updateCoeff * val);
  }

  return returnValue;
}